

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

var cs::make_member_visitor<std::pair<cs_impl::any,cs_impl::any>>
              (offset_in_pair<cs_impl::any,_cs_impl::any>_to_var member)

{
  proxy *in_RDI;
  anon_class_8_1_60e67bd8 *in_stack_ffffffffffffffa8;
  types *args_1;
  cni *in_stack_ffffffffffffffc8;
  types local_18 [6];
  
  args_1 = local_18;
  cs_impl::cni::
  cni<cs::make_member_visitor<std::pair<cs_impl::any,cs_impl::any>>(cs_impl::any_std::pair<cs_impl::any,cs_impl::any>::*)::_lambda(std::pair<cs_impl::any,cs_impl::any>const&)_1_>
            ((cni *)in_RDI,in_stack_ffffffffffffffa8);
  cs_impl::any::make_protect<cs::callable,cs_impl::cni,cs::callable::types>
            (in_stack_ffffffffffffffc8,args_1);
  cs_impl::cni::~cni((cni *)in_RDI);
  return (var)in_RDI;
}

Assistant:

var make_member_visitor(var _Class::* member)
	{
		return var::make_protect<callable>(
		cni([member](const _Class &__this) {
			return __this.*member;
		}),
		cs::callable::types::member_visitor);
	}